

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_convertable.c
# Opt level: O1

int mpt_print_convertable
              (mpt_convertable *conv,_func_ssize_t_void_ptr_char_ptr_size_t *save,void *dest)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ssize_t sVar4;
  iovec vec;
  mpt_value val;
  uint8_t buf [256];
  char *local_148;
  size_t local_140;
  mpt_value local_138;
  undefined1 local_128 [256];
  
  iVar2 = (*conv->_vptr->convert)(conv,0x43,&local_148);
  if (iVar2 < 0) {
    uVar3 = (*conv->_vptr->convert)(conv,0,(void *)0x0);
    local_138._type = (mpt_type_t)uVar3;
    if ((-1 < (int)uVar3) && (bVar1 = (int)uVar3 < 0x80, uVar3 = 0xfffffffd, bVar1)) {
      uVar3 = (*conv->_vptr->convert)(conv,local_138._type,local_128);
      if (-1 < (int)uVar3) {
        local_138._addr = local_128;
        uVar3 = mpt_print_value(&local_138,save,dest);
      }
    }
  }
  else {
    sVar4 = (*save)(dest,local_148,local_140);
    uVar3 = (uint)sVar4;
  }
  return uVar3;
}

Assistant:

extern int mpt_print_convertable(MPT_INTERFACE(convertable) *conv, ssize_t (*save)(void *, const char *, size_t), void *dest)
{
	struct iovec vec;
	int type;
	
	/* only default namespace is supported */
	if ((type = conv->_vptr->convert(conv, MPT_type_toVector('c'), &vec)) >= 0) {
		return save(dest, vec.iov_base, vec.iov_len);
	}
	/* get default type of convertable */
	if ((type = conv->_vptr->convert(conv, 0, 0)) < 0) {
		return type;
	}
	/* only core value types are supported */
	if (type < MPT_ENUM(TypeConvertablePtr)) {
		MPT_STRUCT(value) val;
		uint8_t buf[256];
		int ret;
		/* copy data to buffer */
		if ((ret = conv->_vptr->convert(conv, type, buf)) < 0) {
			return ret;
		}
		MPT_value_set(&val, type, buf);
		return mpt_print_value(&val, save, dest);
	}
	return MPT_ERROR(BadType);
}